

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::ReleaseLast
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  int iVar1;
  int iVar2;
  long lVar3;
  LogMessage *pLVar4;
  MessageLite *pMVar5;
  long lVar6;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseLast",CPPTYPE_MESSAGE);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      pLVar4 = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    pMVar5 = ExtensionSet::ReleaseLast
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (long)this->extensions_offset_),*(int *)(field + 0x28));
  }
  else {
    lVar6 = (long)this->offsets_
                  [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                   -0x11111111];
    if (*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6) < 1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x3bb);
      pLVar4 = LogMessage::operator<<(&local_60,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    lVar3 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar6);
    iVar1 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6);
    *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6) = iVar1 + -1;
    pMVar5 = *(MessageLite **)(lVar3 + -8 + (long)iVar1 * 8);
    iVar2 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6 + 4);
    *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6 + 4) = iVar2 + -1;
    if (iVar1 < iVar2) {
      *(undefined8 *)(lVar3 + -8 + (long)iVar1 * 8) = *(undefined8 *)(lVar3 + -8 + (long)iVar2 * 8);
    }
  }
  return (Message *)pMVar5;
}

Assistant:

Message* GeneratedMessageReflection::ReleaseLast(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(ReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseLast(field->number()));
  } else {
    return MutableRaw<RepeatedPtrFieldBase>(message, field)
        ->ReleaseLast<GenericTypeHandler<Message> >();
  }
}